

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::AllocateSharedDataItems
          (CSharedMemoryObject *this,SHMPTR *pshmObjData,SHMObjData **ppsmod)

{
  DWORD DVar1;
  SHMPTR shmptr;
  SHMObjData *__s;
  SHMPTR SVar2;
  CObjectType *pCVar3;
  PAL_ERROR PVar4;
  
  if (pshmObjData == (SHMPTR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x134);
    fprintf(_stderr,"Expression: NULL != pshmObjData\n");
  }
  if (ppsmod == (SHMObjData **)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x135);
    fprintf(_stderr,"Expression: NULL != ppsmod\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_002dda45;
  SHMLock();
  shmptr = SHMalloc(0x48);
  if (shmptr == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002dda45;
LAB_002dda25:
    PVar4 = 0xe;
  }
  else {
    __s = (SHMObjData *)SHMPtrToPtr(shmptr);
    if (__s == (SHMObjData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x14e);
      fprintf(_stderr,"Expression: NULL != psmod\n");
    }
    memset(__s,0,0x48);
    pCVar3 = (this->super_CPalObjectBase).m_pot;
    __s->eTypeId = pCVar3->m_eTypeId;
    __s->lProcessRefCount = 1;
    DVar1 = (this->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength;
    if (DVar1 != 0) {
      __s->dwNameLength = DVar1;
      SVar2 = SHMWStrDup((this->super_CPalObjectBase).m_oa.sObjectName.m_pwsz);
      __s->shmObjName = SVar2;
      if (SVar2 != 0) {
        pCVar3 = (this->super_CPalObjectBase).m_pot;
        goto LAB_002dd9c5;
      }
LAB_002dda0f:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002dda45;
      FreeSharedDataAreas(shmptr);
      goto LAB_002dda25;
    }
LAB_002dd9c5:
    if ((ulong)pCVar3->m_dwImmutableDataSize != 0) {
      SVar2 = SHMalloc((ulong)pCVar3->m_dwImmutableDataSize);
      __s->shmObjImmutableData = SVar2;
      if (SVar2 == 0) goto LAB_002dda0f;
      pCVar3 = (this->super_CPalObjectBase).m_pot;
    }
    if ((ulong)pCVar3->m_dwSharedDataSize != 0) {
      SVar2 = SHMalloc((ulong)pCVar3->m_dwSharedDataSize);
      __s->shmObjSharedData = SVar2;
      if (SVar2 == 0) goto LAB_002dda0f;
    }
    *pshmObjData = shmptr;
    *ppsmod = __s;
    PVar4 = 0;
  }
  SHMRelease();
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar4;
  }
LAB_002dda45:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::AllocateSharedDataItems(
    SHMPTR *pshmObjData,
    SHMObjData **ppsmod
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmod = SHMNULL;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pshmObjData);
    _ASSERTE(NULL != ppsmod);

    ENTRY("CSharedMemoryObject::AllocateSharedDataItems"
        "(this = %p, pshmObjData = %p, ppsmod = %p)\n",
        this,
        pshmObjData,
        ppsmod
        );
        
    //
    // We're about to make a number of shared memory allocations,
    // so grab the lock for the entirety of the routine.
    //

    SHMLock();

    shmod = SHMalloc(sizeof(SHMObjData));
    if (SHMNULL == shmod)
    {
        ERROR("Unable to allocate m_shmod for new object\n");
        palError = ERROR_OUTOFMEMORY;
        goto AllocateSharedDataItemsExit;
    }

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmod);
    _ASSERTE(NULL != psmod);

    ZeroMemory(psmod, sizeof(*psmod));

    psmod->eTypeId = m_pot->GetId();
    psmod->lProcessRefCount = 1;

    if (0 != m_oa.sObjectName.GetStringLength())
    {
        psmod->dwNameLength = m_oa.sObjectName.GetStringLength();
        psmod->shmObjName = SHMWStrDup(m_oa.sObjectName.GetString());
        if (SHMNULL == psmod->shmObjName)
        {
            ERROR("Unable to allocate psmod->shmObjName for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetImmutableDataSize())
    {
        //
        // The shared copy of the object's immutable data will be initialized
        // by CSharedMemoryObjectManager::RegisterObject or PromoteSharedData
        //
        
        psmod->shmObjImmutableData = SHMalloc(m_pot->GetImmutableDataSize());
        if (SHMNULL == psmod->shmObjImmutableData)
        {
            ERROR("Unable to allocate psmod->shmObjImmutableData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetSharedDataSize())
    {
        psmod->shmObjSharedData = SHMalloc(m_pot->GetSharedDataSize());
        if (SHMNULL == psmod->shmObjSharedData)
        {
            ERROR("Unable to allocate psmod->shmObjSharedData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    *pshmObjData = shmod;
    *ppsmod = psmod;

AllocateSharedDataItemsExit:

    if (NO_ERROR != palError && SHMNULL != shmod)
    {
        FreeSharedDataAreas(shmod);
    }

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::AllocateSharedDataItems returns %d\n", palError);

    return palError;
}